

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
          (exception *this,CylHead *args,char (*args_1) [8],int *args_2,char (*args_3) [29],
          int *args_4,char (*args_5) [2])

{
  char (*in_stack_ffffffffffffff80) [2];
  string local_58;
  int *local_38;
  int *args_local_4;
  char (*args_local_3) [29];
  int *args_local_2;
  char (*args_local_1) [8];
  CylHead *args_local;
  exception *this_local;
  
  local_38 = args_4;
  args_local_4 = (int *)args_3;
  args_local_3 = (char (*) [29])args_2;
  args_local_2 = (int *)args_1;
  args_local_1 = (char (*) [8])args;
  args_local = (CylHead *)this;
  make_string<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
            (&local_58,(util *)args,(CylHead *)args_1,(char (*) [8])args_2,(int *)args_3,
             (char (*) [29])args_4,(int *)args_5,in_stack_ffffffffffffff80);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}